

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

void __thiscall
MakefileGenerator::callExtraCompilerDependCommand
          (MakefileGenerator *this,ProString *extraCompiler,QString *tmp_dep_cmd,QString *inpf,
          QString *tmp_out,bool dep_lines,QStringList *deps,bool existingDepsOnly,
          bool checkCommandAvailability)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  MakefileGenerator *__stream;
  size_t sVar4;
  QList<QString> *l;
  qsizetype qVar5;
  QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String>,_QString>
  *this_00;
  QString *in_RCX;
  MakefileGenerator *in_RDX;
  QString *in_RDI;
  long in_FS_OFFSET;
  byte in_stack_00000010;
  byte in_stack_00000018;
  QString *file;
  int i;
  int read_in;
  FILE *proc;
  QString localFile;
  QString absFile;
  QStringList dep_cmd_deps;
  QDir outDir;
  QString indeps;
  QByteArray depData;
  QFlagsStorage<MakefileGenerator::FileFixifyType> in_stack_0000018c;
  QString dep_cmd;
  char buff [256];
  QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String>,_QString>
  *in_stack_fffffffffffffc28;
  undefined6 in_stack_fffffffffffffc30;
  byte in_stack_fffffffffffffc36;
  byte in_stack_fffffffffffffc37;
  QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String> *in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc40;
  undefined2 in_stack_fffffffffffffc44;
  undefined2 uVar6;
  undefined1 in_stack_fffffffffffffc46;
  undefined1 uVar7;
  undefined1 in_stack_fffffffffffffc47;
  undefined1 lineMode;
  QString *in_stack_fffffffffffffc48;
  MakefileGenerator *this_01;
  QString *in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  QString *in_stack_fffffffffffffcb8;
  QDir *in_stack_fffffffffffffcc0;
  MakefileGenerator *in_stack_fffffffffffffcc8;
  undefined1 in_stack_fffffffffffffcd7;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  MakefileGenerator *in_stack_fffffffffffffce0;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  QList<QString> local_2b8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined8 local_280;
  undefined8 local_278;
  undefined8 local_270;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined1 local_108 [256];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_108,0xaa,0x100);
  local_120 = 0xaaaaaaaaaaaaaaaa;
  local_118 = 0xaaaaaaaaaaaaaaaa;
  local_110 = 0xaaaaaaaaaaaaaaaa;
  replaceExtraCompilerVariables
            ((MakefileGenerator *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
             in_stack_fffffffffffffc68,in_RDI,(QString *)in_RDX,(ReplaceFor)((ulong)in_RCX >> 0x20))
  ;
  if (((in_stack_00000018 & 1) == 0) || (bVar1 = canExecute(in_RDX,in_RCX), bVar1)) {
    QLatin1String::QLatin1String
              ((QLatin1String *)
               CONCAT17(in_stack_fffffffffffffc47,
                        CONCAT16(in_stack_fffffffffffffc46,
                                 CONCAT24(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40))),
               (char *)in_stack_fffffffffffffc38);
    Option::fixPathToLocalOS
              (in_stack_fffffffffffffc48,(bool)in_stack_fffffffffffffc47,
               (bool)in_stack_fffffffffffffc46);
    QMakeInternal::IoUtils::shellQuote((QString *)in_stack_fffffffffffffc28);
    ::operator+((QLatin1String *)in_stack_fffffffffffffc38,
                (QString *)
                CONCAT17(in_stack_fffffffffffffc37,
                         CONCAT16(in_stack_fffffffffffffc36,in_stack_fffffffffffffc30)));
    QLatin1String::QLatin1String
              ((QLatin1String *)
               CONCAT17(in_stack_fffffffffffffc47,
                        CONCAT16(in_stack_fffffffffffffc46,
                                 CONCAT24(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40))),
               (char *)in_stack_fffffffffffffc38);
    ::operator+(&in_stack_fffffffffffffc38->a,
                (QLatin1String *)
                CONCAT17(in_stack_fffffffffffffc37,
                         CONCAT16(in_stack_fffffffffffffc36,in_stack_fffffffffffffc30)));
    fixEnvVariables((QString *)in_stack_fffffffffffffc38);
    ::operator+(in_stack_fffffffffffffc38,
                (QString *)
                CONCAT17(in_stack_fffffffffffffc37,
                         CONCAT16(in_stack_fffffffffffffc36,in_stack_fffffffffffffc30)));
    ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffc28);
    QString::operator=((QString *)
                       CONCAT17(in_stack_fffffffffffffc37,
                                CONCAT16(in_stack_fffffffffffffc36,in_stack_fffffffffffffc30)),
                       (QString *)in_stack_fffffffffffffc28);
    QString::~QString((QString *)0x1915ae);
    QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String>,_QString>::
    ~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String>,_QString>
                     *)CONCAT17(in_stack_fffffffffffffc37,
                                CONCAT16(in_stack_fffffffffffffc36,in_stack_fffffffffffffc30)));
    QString::~QString((QString *)0x1915c8);
    QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String> *)0x1915d5);
    QStringBuilder<QLatin1String,_QString>::~QStringBuilder
              ((QStringBuilder<QLatin1String,_QString> *)0x1915e2);
    QString::~QString((QString *)0x1915ef);
    QString::~QString((QString *)0x1915fc);
    QString::toLatin1((QString *)in_stack_fffffffffffffc28);
    pcVar3 = QByteArray::constData((QByteArray *)0x19161e);
    __stream = (MakefileGenerator *)popen(pcVar3,"r");
    QByteArray::~QByteArray((QByteArray *)0x19163f);
    if (__stream != (MakefileGenerator *)0x0) {
      local_280 = 0xaaaaaaaaaaaaaaaa;
      local_278 = 0xaaaaaaaaaaaaaaaa;
      local_270 = 0xaaaaaaaaaaaaaaaa;
      this_01 = __stream;
      QByteArray::QByteArray((QByteArray *)0x19168f);
      while( true ) {
        iVar2 = feof((FILE *)__stream);
        if (iVar2 == 0) {
          sVar4 = fread(local_108,1,0xff,(FILE *)__stream);
          uVar6 = (undefined2)sVar4;
          uVar7 = (undefined1)(sVar4 >> 0x10);
          lineMode = (undefined1)(sVar4 >> 0x18);
        }
        else {
          uVar6 = 0;
          uVar7 = 0;
          lineMode = 0;
        }
        if (CONCAT13(lineMode,CONCAT12(uVar7,uVar6)) == 0) break;
        QByteArray::append((QByteArray *)in_RDX,(char *)in_RCX,(qsizetype)this_01);
      }
      pclose((FILE *)__stream);
      local_298 = 0xaaaaaaaaaaaaaaaa;
      local_290 = 0xaaaaaaaaaaaaaaaa;
      local_288 = 0xaaaaaaaaaaaaaaaa;
      QString::fromLocal8Bit<void>
                ((QByteArray *)
                 CONCAT17(in_stack_fffffffffffffc37,
                          CONCAT16(in_stack_fffffffffffffc36,in_stack_fffffffffffffc30)));
      bVar1 = QString::isEmpty((QString *)0x19174a);
      if (!bVar1) {
        local_2a0 = 0xaaaaaaaaaaaaaaaa;
        QDir::QDir((QDir *)&local_2a0,(QString *)&Option::output_dir);
        local_2b8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_2b8.d.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
        local_2b8.d.size = -0x5555555555555556;
        splitDeps((QString *)this_01,(bool)lineMode);
        iVar2 = 0;
        while( true ) {
          l = (QList<QString> *)(long)iVar2;
          qVar5 = QList<QString>::size(&local_2b8);
          if (qVar5 <= (long)l) break;
          this_00 = (QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String>,_QString>
                     *)QList<QString>::operator[]
                                 ((QList<QString> *)
                                  CONCAT17(in_stack_fffffffffffffc37,
                                           CONCAT16(in_stack_fffffffffffffc36,
                                                    in_stack_fffffffffffffc30)),
                                  (qsizetype)in_stack_fffffffffffffc28);
          local_2d0 = 0xaaaaaaaaaaaaaaaa;
          local_2c8 = 0xaaaaaaaaaaaaaaaa;
          local_2c0 = 0xaaaaaaaaaaaaaaaa;
          QDir::absoluteFilePath((QString *)&local_2d0);
          bVar1 = ::operator==((QString *)
                               CONCAT17(in_stack_fffffffffffffc37,
                                        CONCAT16(in_stack_fffffffffffffc36,in_stack_fffffffffffffc30
                                                )),(QString *)in_stack_fffffffffffffc28);
          if (!bVar1) {
            QString::QString((QString *)
                             CONCAT17(in_stack_fffffffffffffc37,
                                      CONCAT16(in_stack_fffffffffffffc36,in_stack_fffffffffffffc30))
                             ,(QString *)in_stack_fffffffffffffc28);
            in_stack_fffffffffffffc37 =
                 exists(this_01,(QString *)
                                CONCAT17(lineMode,CONCAT16(uVar7,CONCAT24(uVar6,
                                                  in_stack_fffffffffffffc40))));
            QString::~QString((QString *)0x1918bd);
            if ((in_stack_fffffffffffffc37 & 1) == 0) {
              local_300 = 0xaaaaaaaaaaaaaaaa;
              local_2f8 = 0xaaaaaaaaaaaaaaaa;
              local_2f0 = 0xaaaaaaaaaaaaaaaa;
              resolveDependency(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                                in_stack_fffffffffffffcb8);
              bVar1 = QString::isEmpty((QString *)0x191937);
              if (bVar1) {
                QString::QString((QString *)
                                 CONCAT17(in_stack_fffffffffffffc37,
                                          CONCAT16(in_stack_fffffffffffffc36,
                                                   in_stack_fffffffffffffc30)),
                                 (QString *)in_stack_fffffffffffffc28);
                in_stack_fffffffffffffc36 =
                     exists(this_01,(QString *)
                                    CONCAT17(lineMode,CONCAT16(uVar7,CONCAT24(uVar6,
                                                  in_stack_fffffffffffffc40))));
                QString::~QString((QString *)0x191975);
                if ((in_stack_fffffffffffffc36 & 1) == 0) {
                  if ((in_stack_00000010 & 1) == 0) {
                    QString::operator=((QString *)this_00,(QString *)&local_2d0);
                  }
                  else {
                    QString::clear((QString *)
                                   CONCAT17(in_stack_fffffffffffffc37,
                                            CONCAT16(in_stack_fffffffffffffc36,
                                                     in_stack_fffffffffffffc30)));
                  }
                }
                else {
                  ProString::toLatin1((ProString *)this_01);
                  pcVar3 = QByteArray::constData((QByteArray *)0x19199e);
                  warn_msg(WarnDeprecated,
                           ".depend_command for extra compiler %s prints paths relative to source directory"
                           ,pcVar3);
                  QByteArray::~QByteArray((QByteArray *)0x1919c1);
                }
              }
              else {
                QString::operator=((QString *)this_00,(QString *)&local_300);
              }
              QString::~QString((QString *)0x191a0b);
            }
            else {
              QString::operator=((QString *)this_00,(QString *)&local_2d0);
            }
          }
          bVar1 = QString::isEmpty((QString *)0x191a17);
          if (!bVar1) {
            QFlags<MakefileGenerator::FileFixifyType>::QFlags
                      ((QFlags<MakefileGenerator::FileFixifyType> *)
                       CONCAT17(in_stack_fffffffffffffc37,
                                CONCAT16(in_stack_fffffffffffffc36,in_stack_fffffffffffffc30)),
                       (FileFixifyType)((ulong)this_00 >> 0x20));
            fileFixify(in_stack_fffffffffffffce0,
                       (QString *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                       (FileFixifyTypes)in_stack_0000018c.i,(bool)in_stack_fffffffffffffcd7);
            QString::operator=((QString *)
                               CONCAT17(in_stack_fffffffffffffc37,
                                        CONCAT16(in_stack_fffffffffffffc36,in_stack_fffffffffffffc30
                                                )),(QString *)this_00);
            QString::~QString((QString *)0x191a75);
            in_stack_fffffffffffffc28 = this_00;
          }
          QString::~QString((QString *)0x191a82);
          iVar2 = iVar2 + 1;
        }
        QList<QString>::append
                  ((QList<QString> *)
                   CONCAT17(lineMode,CONCAT16(uVar7,CONCAT24(uVar6,in_stack_fffffffffffffc40))),l);
        QList<QString>::~QList((QList<QString> *)0x191ab4);
        QDir::~QDir((QDir *)&local_2a0);
      }
      QString::~QString((QString *)0x191ad6);
      QByteArray::~QByteArray((QByteArray *)0x191ae3);
    }
  }
  QString::~QString((QString *)0x191b04);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void MakefileGenerator::callExtraCompilerDependCommand(const ProString &extraCompiler,
                                                       const QString &tmp_dep_cmd,
                                                       const QString &inpf,
                                                       const QString &tmp_out,
                                                       bool dep_lines,
                                                       QStringList *deps,
                                                       bool existingDepsOnly,
                                                       bool checkCommandAvailability)
{
    char buff[256];
    QString dep_cmd = replaceExtraCompilerVariables(tmp_dep_cmd, inpf, tmp_out, LocalShell);
    if (checkCommandAvailability && !canExecute(dep_cmd))
        return;
    dep_cmd = QLatin1String("cd ")
            + IoUtils::shellQuote(Option::fixPathToLocalOS(Option::output_dir, false))
            + QLatin1String(" && ")
            + fixEnvVariables(dep_cmd);
    if (FILE *proc = QT_POPEN(dep_cmd.toLatin1().constData(), QT_POPEN_READ)) {
        QByteArray depData;
        while (int read_in = feof(proc) ? 0 : (int)fread(buff, 1, 255, proc))
            depData.append(buff, read_in);
        QT_PCLOSE(proc);
        const QString indeps = QString::fromLocal8Bit(depData);
        if (indeps.isEmpty())
            return;
        QDir outDir(Option::output_dir);
        QStringList dep_cmd_deps = splitDeps(indeps, dep_lines);
        for (int i = 0; i < dep_cmd_deps.size(); ++i) {
            QString &file = dep_cmd_deps[i];
            const QString absFile = outDir.absoluteFilePath(file);
            if (absFile == file) {
                // already absolute; don't do any checks.
            } else if (exists(absFile)) {
                file = absFile;
            } else {
                const QString localFile = resolveDependency(outDir, file);
                if (localFile.isEmpty()) {
                    if (exists(file)) {
                        warn_msg(WarnDeprecated, ".depend_command for extra compiler %s"
                                 " prints paths relative to source directory",
                                 extraCompiler.toLatin1().constData());
                    } else if (existingDepsOnly) {
                        file.clear();
                    } else {
                        file = absFile;  // fallback for generated resources
                    }
                } else {
                    file = localFile;
                }
            }
            if (!file.isEmpty())
                file = fileFixify(file);
        }
        deps->append(dep_cmd_deps);
    }
}